

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_tests.cpp
# Opt level: O3

void __thiscall allocator_tests::lockedpool_tests_live::test_method(lockedpool_tests_live *this)

{
  LockedPoolManager *this_00;
  int *__ptr;
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  Stats initial;
  check_type cVar3;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  assertion_result local_180;
  char **local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  char **local_148;
  assertion_result local_130;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  Stats local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::call_once<void(&)()>
            ((once_flag *)&LockedPoolManager::Instance()::init_flag,
             LockedPoolManager::CreateInstance);
  this_00 = LockedPoolManager::_instance;
  LockedPool::stats(&local_68,&LockedPoolManager::_instance->super_LockedPool);
  __ptr = (int *)LockedPool::alloc(&this_00->super_LockedPool,0x10);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xdd;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "a0";
  local_130.m_message.px = (element_type *)0xe58d40;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_90 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_148 = (char **)&local_130;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(__ptr != (int *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_160,1,0,WARN,_cVar3,(size_t)&local_98,0xdd);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  *__ptr = 0x1234;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xe0;
  file_00.m_begin = (iterator)&local_a8;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*__ptr == 0x1234);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "*((uint32_t*)a0) == 0x1234";
  local_130.m_message.px = (element_type *)0xe33850;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_c0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_148 = (char **)&local_130;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_160,1,0,WARN,_cVar3,(size_t)&local_c8,0xe0);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  LockedPool::free(&this_00->super_LockedPool,__ptr);
  LockedPool::free(&this_00->super_LockedPool,__ptr);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xe5;
  file_01.m_begin = (iterator)&local_d8;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e8,msg_01
            );
  local_180._0_8_ = (ulong)(uint7)local_180._1_7_ << 8;
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130._0_8_ = "0";
  local_130.m_message.px = (element_type *)0xf9bfe2;
  local_160[8] = false;
  local_160._0_8_ = &PTR__lazy_ostream_01389048;
  local_150 = boost::unit_test::lazy_ostream::inst;
  local_148 = (char **)&local_130;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_f0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_160,1,0,WARN,_cVar3,(size_t)&local_f8,0xe5);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xea;
  file_02.m_begin = (iterator)&local_108;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_118,
             msg_02);
  LockedPool::stats((Stats *)local_160,&this_00->super_LockedPool);
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = &local_190;
  local_190 = "pool.stats().total <= (initial.total + LockedPool::ARENA_SIZE)";
  local_188 = "";
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_01389048;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_198 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_150 <= (undefined1 *)(local_68.total + 0x40000));
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)&local_180,1,0,WARN,_cVar3,(size_t)&local_1a0,0xea);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xec;
  file_03.m_begin = (iterator)&local_1b0;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1c0,
             msg_03);
  LockedPool::stats((Stats *)local_160,&this_00->super_LockedPool);
  local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_160._0_8_ == local_68.used);
  local_130.m_message.px = (element_type *)0x0;
  local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190 = "pool.stats().used == initial.used";
  local_188 = "";
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_01389048;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_168 = &local_190;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_1c8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_130,(lazy_ostream *)&local_180,1,0,WARN,_cVar3,(size_t)&local_1d0,0xec);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(lockedpool_tests_live)
{
    LockedPoolManager &pool = LockedPoolManager::Instance();
    LockedPool::Stats initial = pool.stats();

    void *a0 = pool.alloc(16);
    BOOST_CHECK(a0);
    // Test reading and writing the allocated memory
    *((uint32_t*)a0) = 0x1234;
    BOOST_CHECK(*((uint32_t*)a0) == 0x1234);

    pool.free(a0);
    try { // Test exception on double-free
        pool.free(a0);
        BOOST_CHECK(0);
    } catch(std::runtime_error &)
    {
    }
    // If more than one new arena was allocated for the above tests, something is wrong
    BOOST_CHECK(pool.stats().total <= (initial.total + LockedPool::ARENA_SIZE));
    // Usage must be back to where it started
    BOOST_CHECK(pool.stats().used == initial.used);
}